

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O0

ssize_t __thiscall Pl_StdioFile::write(Pl_StdioFile *this,int __fd,void *__buf,size_t __n)

{
  size_t __n_00;
  size_t __ptr;
  pointer pMVar1;
  Pl_StdioFile *pPVar2;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t so_far;
  size_t len_local;
  uchar *buf_local;
  Pl_StdioFile *this_local;
  
  len_local = CONCAT44(in_register_00000034,__fd);
  local_28 = 0;
  pPVar2 = this;
  so_far = (size_t)__buf;
  buf_local = (uchar *)this;
  while (__ptr = len_local, __n_00 = so_far, so_far != 0) {
    pMVar1 = std::unique_ptr<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>::
             operator->(&this->m);
    local_28 = fwrite((void *)__ptr,1,__n_00,(FILE *)pMVar1->file);
    if (local_28 == 0) {
      std::operator+(&local_48,&(this->super_Pipeline).identifier,": Pl_StdioFile::write");
      QUtil::throw_system_error(&local_48);
      pPVar2 = (Pl_StdioFile *)std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      len_local = local_28 + len_local;
      pPVar2 = (Pl_StdioFile *)(so_far - local_28);
      so_far = (size_t)pPVar2;
    }
  }
  return (ssize_t)pPVar2;
}

Assistant:

void
Pl_StdioFile::write(unsigned char const* buf, size_t len)
{
    size_t so_far = 0;
    while (len > 0) {
        so_far = fwrite(buf, 1, len, m->file);
        if (so_far == 0) {
            QUtil::throw_system_error(this->identifier + ": Pl_StdioFile::write");
        } else {
            buf += so_far;
            len -= so_far;
        }
    }
}